

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mpc.c
# Opt level: O0

void * mpc_malloc(mpc_input_t *i,size_t n)

{
  long lVar1;
  ulong in_RSI;
  long in_RDI;
  char *p;
  size_t j;
  void *local_8;
  
  if (in_RSI < 0x41) {
    lVar1 = *(long *)(in_RDI + 0x70);
    do {
      if (*(char *)(in_RDI + 0x78 + *(long *)(in_RDI + 0x70)) == '\0') {
        lVar1 = *(long *)(in_RDI + 0x70);
        *(undefined1 *)(in_RDI + 0x78 + *(long *)(in_RDI + 0x70)) = 1;
        *(ulong *)(in_RDI + 0x70) = *(long *)(in_RDI + 0x70) + 1U & 0x1ff;
        return (void *)(in_RDI + 0x278 + lVar1 * 0x40);
      }
      *(ulong *)(in_RDI + 0x70) = *(long *)(in_RDI + 0x70) + 1U & 0x1ff;
    } while (lVar1 != *(long *)(in_RDI + 0x70));
    local_8 = malloc(in_RSI);
  }
  else {
    local_8 = malloc(in_RSI);
  }
  return local_8;
}

Assistant:

static void *mpc_malloc(mpc_input_t *i, size_t n) {
  size_t j;
  char *p;

  if (n > sizeof(mpc_mem_t)) { return malloc(n); }

  j = i->mem_index;
  do {
    if (!i->mem_full[i->mem_index]) {
      p = (void*)(i->mem + i->mem_index);
      i->mem_full[i->mem_index] = 1;
      i->mem_index = (i->mem_index+1) % MPC_INPUT_MEM_NUM;
      return p;
    }
    i->mem_index = (i->mem_index+1) % MPC_INPUT_MEM_NUM;
  } while (j != i->mem_index);

  return malloc(n);
}